

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDHash::Compare(ON_SubDHash *lhs,ON_SubDHash *rhs)

{
  int rc;
  ON_SubDHash *rhs_local;
  ON_SubDHash *lhs_local;
  
  if (lhs->m_vertex_count < rhs->m_vertex_count) {
    lhs_local._4_4_ = -1;
  }
  else if (rhs->m_vertex_count < lhs->m_vertex_count) {
    lhs_local._4_4_ = 1;
  }
  else if (lhs->m_edge_count < rhs->m_edge_count) {
    lhs_local._4_4_ = -1;
  }
  else if (rhs->m_edge_count < lhs->m_edge_count) {
    lhs_local._4_4_ = 1;
  }
  else if (lhs->m_face_count < rhs->m_face_count) {
    lhs_local._4_4_ = -1;
  }
  else if (rhs->m_face_count < lhs->m_face_count) {
    lhs_local._4_4_ = 1;
  }
  else {
    lhs_local._4_4_ = ON_SHA1_Hash::Compare(&lhs->m_vertex_hash,&rhs->m_vertex_hash);
    if ((lhs_local._4_4_ == 0) &&
       (lhs_local._4_4_ = ON_SHA1_Hash::Compare(&lhs->m_edge_hash,&rhs->m_edge_hash),
       lhs_local._4_4_ == 0)) {
      lhs_local._4_4_ = ON_SHA1_Hash::Compare(&lhs->m_face_hash,&rhs->m_face_hash);
    }
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubDHash::Compare(const ON_SubDHash& lhs, const ON_SubDHash& rhs)
{
  if (lhs.m_vertex_count < rhs.m_vertex_count)
    return -1;
  if (lhs.m_vertex_count > rhs.m_vertex_count)
    return 1;

  if (lhs.m_edge_count < rhs.m_edge_count)
    return -1;
  if (lhs.m_edge_count > rhs.m_edge_count)
    return 1;

  if (lhs.m_face_count < rhs.m_face_count)
    return -1;
  if (lhs.m_face_count > rhs.m_face_count)
    return 1;

  int rc;

  rc = ON_SHA1_Hash::Compare(lhs.m_vertex_hash, rhs.m_vertex_hash);
  if (0 != rc)
    return rc;

  rc = ON_SHA1_Hash::Compare(lhs.m_edge_hash, rhs.m_edge_hash);
  if (0 != rc)
    return rc;

  return ON_SHA1_Hash::Compare(lhs.m_face_hash, rhs.m_face_hash);
}